

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

void __thiscall
tf::UnboundedTaskQueue<void_*>::~UnboundedTaskQueue(UnboundedTaskQueue<void_*> *this)

{
  bool bVar1;
  reference ppAVar2;
  __pointer_type this_00;
  vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
  *in_RDI;
  Array *a;
  iterator __end0;
  iterator __begin0;
  vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
  *__range2;
  vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
  *in_stack_ffffffffffffffb8;
  Array *in_stack_ffffffffffffffc0;
  Array *in_stack_ffffffffffffffc8;
  __normal_iterator<tf::UnboundedTaskQueue<void_*>::Array_**,_std::vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>_>
  local_18;
  vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
  *local_10;
  
  local_10 = in_RDI + 6;
  local_18._M_current =
       (Array **)
       std::
       vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<tf::UnboundedTaskQueue<void_*>::Array_**,_std::vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<tf::UnboundedTaskQueue<void_*>::Array_**,_std::vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<tf::UnboundedTaskQueue<void_*>::Array_**,_std::vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffc8 = *ppAVar2;
    if (in_stack_ffffffffffffffc8 != (Array *)0x0) {
      Array::~Array(in_stack_ffffffffffffffc0);
      operator_delete(in_stack_ffffffffffffffc8,0x18);
    }
    __gnu_cxx::
    __normal_iterator<tf::UnboundedTaskQueue<void_*>::Array_**,_std::vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>_>
    ::operator++(&local_18);
  }
  this_00 = std::atomic<tf::UnboundedTaskQueue<void_*>::Array_*>::load
                      ((atomic<tf::UnboundedTaskQueue<void_*>::Array_*> *)in_stack_ffffffffffffffc8,
                       (memory_order)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (this_00 != (__pointer_type)0x0) {
    Array::~Array(this_00);
    operator_delete(this_00,0x18);
  }
  std::
  vector<tf::UnboundedTaskQueue<void_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<void_*>::Array_*>_>
  ::~vector(in_RDI);
  return;
}

Assistant:

UnboundedTaskQueue<T>::~UnboundedTaskQueue() {
  for(auto a : _garbage) {
    delete a;
  }
  delete _array.load();
}